

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,Option *opt)

{
  int *piVar1;
  size_t __size;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  Allocator *pAVar6;
  Allocator *pAVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  int *piVar11;
  int n_1;
  uint uVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  ulong uVar15;
  undefined4 extraout_var_00;
  void *pvVar16;
  undefined4 extraout_var_01;
  ulong uVar17;
  void *pvVar18;
  int iVar19;
  uint uVar20;
  int i;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  void *pvVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  void *pvVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  void *local_3d0;
  void *local_3c8;
  void *local_3b8;
  int *local_3a0;
  int *local_380;
  void *local_370;
  float w4 [6];
  float w3 [6];
  float w2 [6];
  float w1 [6];
  Mat local_2c8;
  void *ptr;
  undefined8 uStack_280;
  undefined4 uStack_278;
  undefined4 uStack_274;
  int iStack_270;
  Allocator *local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  size_t sStack_250;
  float t2 [6];
  float t1 [6];
  float t0 [6];
  float w5 [6];
  float w0 [6];
  float d1 [6];
  float t5 [6];
  float t4 [6];
  float t3 [6];
  float d5 [6];
  float d4 [6];
  float d3 [6];
  float d2 [6];
  
  iVar14 = bottom_blob->c;
  lVar38 = (long)iVar14;
  iVar2 = top_blob->w;
  iVar3 = top_blob->h;
  uVar4 = top_blob->c;
  local_2c8.data = bottom_blob->data;
  local_2c8.refcount = bottom_blob->refcount;
  local_2c8.elemsize = bottom_blob->elemsize;
  local_2c8.packing = bottom_blob->packing;
  local_2c8.allocator = bottom_blob->allocator;
  local_2c8.dims = bottom_blob->dims;
  local_2c8.w = bottom_blob->w;
  local_2c8.h = bottom_blob->h;
  local_2c8.cstep = bottom_blob->cstep;
  iVar13 = local_2c8.w;
  iVar19 = local_2c8.h;
  if (local_2c8.refcount != (int *)0x0) {
    LOCK();
    *local_2c8.refcount = *local_2c8.refcount + 1;
    UNLOCK();
    iVar13 = bottom_blob->w;
    iVar19 = bottom_blob->h;
  }
  uVar24 = iVar2 + 6;
  if (-1 < (int)(iVar2 + 3U)) {
    uVar24 = iVar2 + 3U;
  }
  uVar29 = uVar24 & 0xfffffffc;
  uVar10 = iVar3 + 6;
  if (-1 < (int)(iVar3 + 3U)) {
    uVar10 = iVar3 + 3U;
  }
  iVar32 = uVar29 + 2;
  local_2c8.c = iVar14;
  copy_make_border(bottom_blob,&local_2c8,0,((uVar10 & 0xfffffffc) + 2) - iVar19,0,iVar32 - iVar13,0
                   ,0.0,opt->workspace_allocator,opt->num_threads);
  uVar24 = (int)uVar24 >> 2;
  uVar39 = (int)uVar10 >> 2;
  pvVar5 = _bias->data;
  uVar12 = uVar39 * uVar24;
  pAVar6 = opt->workspace_allocator;
  uVar17 = (ulong)(int)(uVar12 * 0x24);
  lVar22 = (uVar17 & 0x3ffffffffffffffc) * lVar38;
  if (lVar22 == 0) {
    local_3a0 = (int *)0x0;
    local_3d0 = (void *)0x0;
  }
  else {
    if (pAVar6 == (Allocator *)0x0) {
      local_3d0 = (void *)0x0;
      ptr = (void *)0x0;
      iVar13 = posix_memalign(&ptr,0x10,lVar22 * 4 + 4);
      if (iVar13 == 0) {
        local_3d0 = ptr;
      }
    }
    else {
      iVar13 = (*pAVar6->_vptr_Allocator[2])();
      local_3d0 = (void *)CONCAT44(extraout_var,iVar13);
    }
    local_3a0 = (int *)((long)local_3d0 + lVar22 * 4);
    *(undefined4 *)((long)local_3d0 + lVar22 * 4) = 1;
  }
  if (0 < iVar14) {
    lVar22 = (long)iVar32;
    uVar20 = 1;
    if (1 < (int)uVar24) {
      uVar20 = uVar24;
    }
    uVar26 = 1;
    if (1 < (int)uVar39) {
      uVar26 = (ulong)uVar39;
    }
    local_3b8 = (void *)0x0;
    do {
      if (0 < iVar3) {
        pvVar34 = (void *)(uVar17 * 4 * (long)local_3b8 + (long)local_3d0);
        uVar15 = 0;
        do {
          if (0 < iVar2) {
            lVar27 = (long)local_2c8.data +
                     (long)(iVar32 * 4 * (int)uVar15) * 4 +
                     local_2c8.cstep * local_2c8.elemsize * (long)local_3b8;
            lVar36 = lVar27 + lVar22 * 4;
            lVar25 = lVar36 + lVar22 * 4;
            lVar30 = lVar22 * 4 + lVar25;
            lVar40 = lVar30 + lVar22 * 4;
            lVar33 = lVar40 + lVar22 * 4;
            uVar21 = 0;
            do {
              lVar37 = 0;
              do {
                *(undefined4 *)((long)&ptr + lVar37) = *(undefined4 *)(lVar27 + lVar37);
                *(undefined4 *)((long)d1 + lVar37) = *(undefined4 *)(lVar36 + lVar37);
                *(undefined4 *)((long)d2 + lVar37) = *(undefined4 *)(lVar25 + lVar37);
                *(undefined4 *)((long)d3 + lVar37) = *(undefined4 *)(lVar30 + lVar37);
                *(undefined4 *)((long)d4 + lVar37) = *(undefined4 *)(lVar40 + lVar37);
                *(undefined4 *)((long)d5 + lVar37) = *(undefined4 *)(lVar33 + lVar37);
                lVar37 = lVar37 + 4;
              } while (lVar37 != 0x18);
              lVar37 = 0;
              do {
                fVar42 = *(float *)((long)d2 + lVar37);
                fVar43 = *(float *)((long)d4 + lVar37);
                fVar44 = *(float *)((long)d1 + lVar37);
                fVar49 = *(float *)((long)d3 + lVar37);
                *(float *)((long)w0 + lVar37) =
                     fVar42 * -5.0 + fVar43 + *(float *)((long)&ptr + lVar37) * 4.0;
                *(float *)((long)w1 + lVar37) = fVar49 + fVar43 + (fVar44 + fVar42) * -4.0;
                *(float *)((long)w2 + lVar37) = (fVar43 - fVar49) + (fVar44 - fVar42) * 4.0;
                *(float *)((long)w3 + lVar37) =
                     ((fVar43 - fVar42) - (fVar44 + fVar44)) + fVar49 + fVar49;
                *(float *)((long)w4 + lVar37) =
                     (fVar44 + fVar44 + fVar43) - (fVar49 + fVar49 + fVar42);
                *(float *)((long)w5 + lVar37) =
                     fVar49 * -5.0 + fVar44 * 4.0 + *(float *)((long)d5 + lVar37);
                lVar37 = lVar37 + 4;
              } while (lVar37 != 0x18);
              t0[0] = w0[0];
              t1[0] = w0[1];
              t2[0] = w0[2];
              t3[0] = w0[3];
              t4[0] = w0[4];
              t5[0] = w0[5];
              t0[1] = w1[0];
              t1[1] = w1[1];
              t2[1] = w1[2];
              t3[1] = w1[3];
              t4[1] = w1[4];
              t5[1] = w1[5];
              t0[2] = w2[0];
              t1[2] = w2[1];
              t2[2] = w2[2];
              t3[2] = w2[3];
              t4[2] = w2[4];
              t5[2] = w2[5];
              t0[3] = w3[0];
              t1[3] = w3[1];
              t2[3] = w3[2];
              t3[3] = w3[3];
              t4[3] = w3[4];
              t5[3] = w3[5];
              t0[4] = w4[0];
              t1[4] = w4[1];
              t2[4] = w4[2];
              t3[4] = w4[3];
              t4[4] = w4[4];
              t5[4] = w4[5];
              t0[5] = w5[0];
              t1[5] = w5[1];
              t2[5] = w5[2];
              t3[5] = w5[3];
              t4[5] = w5[4];
              t5[5] = w5[5];
              lVar37 = 0;
              do {
                fVar42 = *(float *)((long)t2 + lVar37);
                fVar43 = *(float *)((long)t4 + lVar37);
                fVar44 = *(float *)((long)t1 + lVar37);
                fVar49 = *(float *)((long)t3 + lVar37);
                *(float *)((long)&ptr + lVar37) =
                     fVar42 * -5.0 + fVar43 + *(float *)((long)t0 + lVar37) * 4.0;
                *(float *)((long)d1 + lVar37) = fVar49 + fVar43 + (fVar44 + fVar42) * -4.0;
                *(float *)((long)d2 + lVar37) = (fVar43 - fVar49) + (fVar44 - fVar42) * 4.0;
                *(float *)((long)d3 + lVar37) =
                     ((fVar43 - fVar42) - (fVar44 + fVar44)) + fVar49 + fVar49;
                *(float *)((long)d4 + lVar37) =
                     (fVar44 + fVar44 + fVar43) - (fVar49 + fVar49 + fVar42);
                *(float *)((long)d5 + lVar37) =
                     fVar49 * -5.0 + fVar44 * 4.0 + *(float *)((long)t5 + lVar37);
                lVar37 = lVar37 + 4;
              } while (lVar37 != 0x18);
              lVar37 = 0;
              do {
                *(undefined4 *)((long)pvVar34 + lVar37) = *(undefined4 *)((long)&ptr + lVar37);
                *(undefined4 *)((long)pvVar34 + lVar37 + 0x18) = *(undefined4 *)((long)d1 + lVar37);
                *(undefined4 *)((long)pvVar34 + lVar37 + 0x30) = *(undefined4 *)((long)d2 + lVar37);
                *(undefined4 *)((long)pvVar34 + lVar37 + 0x48) = *(undefined4 *)((long)d3 + lVar37);
                *(undefined4 *)((long)pvVar34 + lVar37 + 0x60) = *(undefined4 *)((long)d4 + lVar37);
                *(undefined4 *)((long)pvVar34 + lVar37 + 0x78) = *(undefined4 *)((long)d5 + lVar37);
                lVar37 = lVar37 + 4;
              } while (lVar37 != 0x18);
              lVar27 = lVar27 + 0x10;
              lVar36 = lVar36 + 0x10;
              lVar25 = lVar25 + 0x10;
              lVar30 = lVar30 + 0x10;
              lVar40 = lVar40 + 0x10;
              lVar33 = lVar33 + 0x10;
              pvVar34 = (void *)((long)pvVar34 + 0x90);
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar20);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar26);
      }
      local_3b8 = (void *)((long)local_3b8 + 1);
    } while (local_3b8 != (void *)lVar38);
  }
  uStack_278 = 0;
  uStack_274 = 0;
  iStack_270 = 0;
  ptr = (void *)0x0;
  uStack_280._0_4_ = 0;
  uStack_280._4_4_ = 0;
  local_268 = (Allocator *)0x0;
  uStack_260._0_4_ = 0;
  uStack_260._4_4_ = 0;
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  sStack_250 = 0;
  if (local_2c8.refcount != (int *)0x0) {
    LOCK();
    *local_2c8.refcount = *local_2c8.refcount + -1;
    UNLOCK();
    if (*local_2c8.refcount == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2c8.refcount = (int *)CONCAT44(uStack_280._4_4_,(undefined4)uStack_280);
  local_2c8.data = ptr;
  local_2c8.elemsize = CONCAT44(uStack_274,uStack_278);
  local_2c8.packing = iStack_270;
  local_2c8.allocator = local_268;
  local_2c8.dims = (int)uStack_260;
  local_2c8.w = uStack_260._4_4_;
  local_2c8.h = (int)local_258;
  local_2c8.c = local_258._4_4_;
  local_2c8.cstep = sStack_250;
  if (local_2c8.refcount != (int *)0x0) {
    LOCK();
    *local_2c8.refcount = *local_2c8.refcount + -1;
    UNLOCK();
    if (*local_2c8.refcount == 0) {
      if (local_268 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_268->_vptr_Allocator[3])();
      }
    }
  }
  pAVar7 = opt->workspace_allocator;
  lVar22 = (uVar17 & 0x3ffffffffffffffc) * (long)(int)uVar4;
  if (lVar22 == 0) {
    local_3c8 = (void *)0x0;
    local_380 = (int *)0x0;
  }
  else {
    if (pAVar7 == (Allocator *)0x0) {
      local_3c8 = (void *)0x0;
      ptr = (void *)0x0;
      iVar13 = posix_memalign(&ptr,0x10,lVar22 * 4 + 4);
      if (iVar13 == 0) {
        local_3c8 = ptr;
      }
    }
    else {
      iVar13 = (*pAVar7->_vptr_Allocator[2])();
      local_3c8 = (void *)CONCAT44(extraout_var_00,iVar13);
    }
    local_380 = (int *)((long)local_3c8 + lVar22 * 4);
    *(undefined4 *)((long)local_3c8 + lVar22 * 4) = 1;
  }
  if (0 < (int)uVar4) {
    iVar13 = kernel_tm->w;
    local_3b8 = kernel_tm->data;
    sVar8 = kernel_tm->elemsize;
    sVar9 = kernel_tm->cstep;
    uVar26 = 0;
    local_370 = local_3c8;
    do {
      if (0 < (int)uVar12) {
        uVar15 = 0;
        pvVar34 = local_3d0;
        pvVar41 = local_370;
        do {
          memset(&ptr,0,0x90);
          if (0 < iVar14) {
            lVar22 = 0;
            pvVar16 = pvVar34;
            pvVar18 = local_3b8;
            do {
              lVar27 = 0;
              do {
                *(float *)((long)&ptr + lVar27 * 4) =
                     *(float *)((long)pvVar18 + lVar27 * 4) * *(float *)((long)pvVar16 + lVar27 * 4)
                     + *(float *)((long)&ptr + lVar27 * 4);
                lVar27 = lVar27 + 1;
              } while (lVar27 != 0x24);
              lVar22 = lVar22 + 1;
              pvVar18 = (void *)((long)pvVar18 + (long)iVar13 * sVar8);
              pvVar16 = (void *)((long)pvVar16 + uVar17 * 4);
            } while (lVar22 != lVar38);
          }
          lVar22 = 0;
          do {
            *(undefined4 *)((long)pvVar41 + lVar22 * 4) = *(undefined4 *)((long)&ptr + lVar22 * 4);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x24);
          uVar15 = uVar15 + 1;
          pvVar34 = (void *)((long)pvVar34 + 0x90);
          pvVar41 = (void *)((long)pvVar41 + 0x90);
        } while (uVar15 != uVar12);
      }
      uVar26 = uVar26 + 1;
      local_3b8 = (void *)((long)local_3b8 + sVar8 * sVar9);
      local_370 = (void *)((long)local_370 + uVar17 * 4);
    } while (uVar26 != uVar4);
  }
  uStack_278 = 0;
  uStack_274 = 0;
  iStack_270 = 0;
  ptr = (void *)0x0;
  uStack_280._0_4_ = 0;
  uStack_280._4_4_ = 0;
  local_268 = (Allocator *)0x0;
  uStack_260._0_4_ = 0;
  uStack_260._4_4_ = 0;
  local_258._0_4_ = 0;
  local_258._4_4_ = 0;
  sStack_250 = 0;
  if (local_3a0 != (int *)0x0) {
    LOCK();
    *local_3a0 = *local_3a0 + -1;
    UNLOCK();
    if (*local_3a0 == 0) {
      if (pAVar6 == (Allocator *)0x0) {
        if (local_3d0 != (void *)0x0) {
          free(local_3d0);
        }
      }
      else {
        (*pAVar6->_vptr_Allocator[3])(pAVar6,local_3d0);
      }
    }
  }
  pAVar6 = local_268;
  pvVar34 = ptr;
  piVar11 = (int *)CONCAT44(uStack_280._4_4_,(undefined4)uStack_280);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_268 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_268->_vptr_Allocator[3])();
      }
    }
  }
  local_268 = opt->workspace_allocator;
  ptr = (void *)0x0;
  uStack_280._0_4_ = 0;
  uStack_280._4_4_ = 0;
  piVar1 = (int *)0x0;
  uStack_278 = 4;
  uStack_274 = 0;
  iStack_270 = 1;
  uStack_260._0_4_ = 3;
  uStack_260._4_4_ = uVar29;
  local_258 = CONCAT44(uVar4,uVar10) & 0xfffffffffffffffc;
  sStack_250 = (long)(int)((uVar10 & 0xfffffffc) * uVar29) & 0x3ffffffffffffff0;
  lVar38 = sStack_250 * (long)(int)uVar4;
  if (lVar38 != 0) {
    __size = lVar38 * 4 + 4;
    if (local_268 == (Allocator *)0x0) {
      d1[0] = 0.0;
      d1[1] = 0.0;
      iVar14 = posix_memalign((void **)d1,0x10,__size);
      ptr = (void *)0x0;
      if (iVar14 == 0) {
        ptr = (void *)d1._0_8_;
      }
    }
    else {
      iVar14 = (*local_268->_vptr_Allocator[2])(local_268,__size);
      ptr = (void *)CONCAT44(extraout_var_01,iVar14);
    }
    piVar1 = (int *)((long)ptr + lVar38 * 4);
    uStack_280._0_4_ = SUB84(piVar1,0);
    uStack_280._4_4_ = (undefined4)((ulong)piVar1 >> 0x20);
    *(undefined4 *)((long)ptr + lVar38 * 4) = 1;
  }
  if (0 < (int)uVar4) {
    uVar26 = 1;
    if (1 < (int)uVar24) {
      uVar26 = (ulong)uVar24;
    }
    uVar15 = 1;
    if (1 < (int)uVar39) {
      uVar15 = (ulong)uVar39;
    }
    lVar38 = (long)(int)uStack_260._4_4_ * CONCAT44(uStack_274,uStack_278);
    uVar31 = 0;
    pvVar41 = local_3c8;
    do {
      if (pvVar5 == (void *)0x0) {
        fVar42 = 0.0;
      }
      else {
        fVar42 = *(float *)((long)pvVar5 + uVar31 * 4);
      }
      if (0 < iVar3) {
        lVar22 = sStack_250 * CONCAT44(uStack_274,uStack_278) * uVar31;
        uVar35 = 0;
        uVar23 = 0;
        do {
          if (0 < iVar2) {
            pvVar16 = (void *)(uVar35 * 0x90 + (long)pvVar41);
            lVar25 = (long)ptr + (uVar23 * 4 + 3) * lVar38 + lVar22;
            lVar36 = (long)ptr + (uVar23 * 4 + 2) * lVar38 + lVar22;
            lVar27 = (long)ptr + (uVar23 * 4 + 1) * lVar38 + lVar22;
            lVar40 = (long)ptr + uVar23 * 4 * lVar38 + lVar22;
            uVar28 = 0;
            do {
              lVar33 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33);
                *(undefined4 *)((long)d2 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33 + 0x18);
                *(undefined4 *)((long)d3 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33 + 0x30);
                *(undefined4 *)((long)d4 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33 + 0x48);
                *(undefined4 *)((long)d5 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33 + 0x60);
                *(undefined4 *)((long)w0 + lVar33) = *(undefined4 *)((long)pvVar16 + lVar33 + 0x78);
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x18);
              lVar33 = 0;
              do {
                fVar49 = *(float *)((long)d3 + lVar33) + *(float *)((long)d2 + lVar33);
                fVar50 = *(float *)((long)d4 + lVar33) + *(float *)((long)d5 + lVar33);
                *(float *)((long)w1 + lVar33) = *(float *)((long)d1 + lVar33) + fVar49 + fVar50;
                fVar43 = *(float *)((long)d4 + lVar33) - *(float *)((long)d5 + lVar33);
                fVar44 = *(float *)((long)d2 + lVar33) - *(float *)((long)d3 + lVar33);
                *(float *)((long)w2 + lVar33) = fVar43 + fVar43 + fVar44;
                *(float *)((long)w3 + lVar33) = fVar50 * 4.0 + fVar49;
                *(float *)((long)w4 + lVar33) =
                     fVar43 * 8.0 + fVar44 + *(float *)((long)w0 + lVar33);
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x18);
              fVar43 = w1[1] + fVar42;
              fVar44 = w2[1] + fVar42;
              fVar49 = w3[1] + fVar42;
              fVar50 = w4[1] + fVar42;
              w5[0] = w1[0] + w1[2] + fVar43 + w1[3] + w1[4];
              w5[1] = w2[0] + w2[2] + fVar44 + w2[3] + w2[4];
              w5[2] = w3[0] + w3[2] + fVar49 + w3[3] + w3[4];
              w5[3] = w4[0] + w4[2] + fVar50 + w4[3] + w4[4];
              fVar45 = w1[3] - w1[4];
              fVar46 = w2[3] - w2[4];
              fVar47 = w3[3] - w3[4];
              fVar48 = w4[3] - w4[4];
              t0[0] = fVar45 + fVar45 + (fVar43 - w1[2]);
              t0[1] = fVar46 + fVar46 + (fVar44 - w2[2]);
              t0[2] = fVar47 + fVar47 + (fVar49 - w3[2]);
              t0[3] = fVar48 + fVar48 + (fVar50 - w4[2]);
              t1[0] = w1[2] + fVar43 + (w1[3] + w1[4]) * 4.0;
              t1[1] = w2[2] + fVar44 + (w2[3] + w2[4]) * 4.0;
              t1[2] = w3[2] + fVar49 + (w3[3] + w3[4]) * 4.0;
              t1[3] = w4[2] + fVar50 + (w4[3] + w4[4]) * 4.0;
              t2[0] = (fVar43 - w1[2]) + w1[5] + fVar45 * 8.0;
              t2[1] = (fVar44 - w2[2]) + w2[5] + fVar46 * 8.0;
              t2[2] = (fVar49 - w3[2]) + w3[5] + fVar47 * 8.0;
              t2[3] = (fVar50 - w4[2]) + w4[5] + fVar48 * 8.0;
              lVar33 = 0;
              do {
                *(undefined4 *)(lVar40 + lVar33) = *(undefined4 *)((long)w5 + lVar33);
                *(undefined4 *)(lVar27 + lVar33) = *(undefined4 *)((long)t0 + lVar33);
                *(undefined4 *)(lVar36 + lVar33) = *(undefined4 *)((long)t1 + lVar33);
                *(undefined4 *)(lVar25 + lVar33) = *(undefined4 *)((long)t2 + lVar33);
                lVar33 = lVar33 + 4;
              } while (lVar33 != 0x10);
              lVar40 = lVar40 + 0x10;
              lVar27 = lVar27 + 0x10;
              lVar36 = lVar36 + 0x10;
              lVar25 = lVar25 + 0x10;
              uVar28 = uVar28 + 1;
              pvVar16 = (void *)((long)pvVar16 + 0x90);
            } while (uVar28 != uVar26);
          }
          uVar23 = uVar23 + 1;
          uVar35 = (ulong)((int)uVar35 + uVar24);
        } while (uVar23 != uVar15);
      }
      uVar31 = uVar31 + 1;
      pvVar41 = (void *)((long)pvVar41 + uVar17 * 4);
    } while (uVar31 != uVar4);
  }
  uStack_280 = piVar1;
  copy_cut_border((Mat *)&ptr,top_blob,0,(int)local_258 - top_blob->h,0,
                  uStack_260._4_4_ - top_blob->w,opt->blob_allocator,opt->num_threads);
  if (uStack_280 != (int *)0x0) {
    LOCK();
    *uStack_280 = *uStack_280 + -1;
    UNLOCK();
    if (*uStack_280 == 0) {
      if (local_268 == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (*local_268->_vptr_Allocator[3])();
      }
    }
  }
  if (local_380 != (int *)0x0) {
    LOCK();
    *local_380 = *local_380 + -1;
    UNLOCK();
    if (*local_380 == 0) {
      if (pAVar7 == (Allocator *)0x0) {
        if (local_3c8 != (void *)0x0) {
          free(local_3c8);
        }
      }
      else {
        (*pAVar7->_vptr_Allocator[3])(pAVar7,local_3c8);
      }
    }
  }
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (pAVar6 == (Allocator *)0x0) {
        if (pvVar34 != (void *)0x0) {
          free(pvVar34);
        }
      }
      else {
        (*pAVar6->_vptr_Allocator[3])(pAVar6,pvVar34);
      }
    }
  }
  if (local_2c8.refcount != (int *)0x0) {
    LOCK();
    *local_2c8.refcount = *local_2c8.refcount + -1;
    UNLOCK();
    if (*local_2c8.refcount == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if (local_2c8.data != (void *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt.workspace_allocator, opt.num_threads);

    const float* bias = _bias;    

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 4u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const float* img = bottom_blob_bordered.channel(q);
            float* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const float* r0 = img + w * j * 4;
                const float* r1 = r0 + w;
                const float* r2 = r1 + w;
                const float* r3 = r2 + w;
                const float* r4 = r3 + w;
                const float* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    float d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    float w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    float t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                float* output0_tm = out0_tm.row(i);

                float sum0[36] = {0.0f};

                for (int q=0; q<inch; q++)
                {
                    const float* r0 = bottom_blob_tm.channel(q).row(i);
                    const float* k0 = kernel0_tm.row(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += r0[n] * k0[n];
                    }                                
                }                  

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            const float bias0 = bias ? bias[p] : 0.f;

            for (int j=0; j<nColBlocks; j++)
            {
                float* outRow0 = out.row(j*4);
                float* outRow1 = out.row(j*4+1);
                float* outRow2 = out.row(j*4+2);
                float* outRow3 = out.row(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    float* out_tile = out_tm.row(j*nRowBlocks + i);

                    float s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    float w0[6],w1[6],w2[6],w3[6];
                    float d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    float o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n]         + bias0;
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n]         + bias0;
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n]         + bias0;
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n] + bias0;
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n];
                        outRow1[n] = o1[n];
                        outRow2[n] = o2[n];
                        outRow3[n] = o3[n];
                    }                    

                    outRow0 += 4;
                    outRow1 += 4;   
                    outRow2 += 4;
                    outRow3 += 4;                        
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt.blob_allocator, opt.num_threads);
}